

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error ft_stroke_border_lineto(FT_StrokeBorder border,FT_Vector *to,FT_Bool movable)

{
  FT_UInt FVar1;
  uint uVar2;
  uint uVar3;
  FT_Vector *pFVar4;
  FT_Byte *pFVar5;
  FT_Byte *tag;
  FT_Vector *vec;
  FT_Error error;
  FT_Bool movable_local;
  FT_Vector *to_local;
  FT_StrokeBorder border_local;
  
  vec._0_4_ = 0;
  if (border->movable == '\0') {
    if ((((border->num_points != 0) && (-2 < border->points[border->num_points - 1].x - to->x)) &&
        (border->points[border->num_points - 1].x - to->x < 2)) &&
       ((-2 < border->points[border->num_points - 1].y - to->y &&
        (border->points[border->num_points - 1].y - to->y < 2)))) {
      return 0;
    }
    vec._0_4_ = ft_stroke_border_grow(border,1);
    if ((FT_Error)vec == 0) {
      pFVar4 = border->points;
      uVar2 = border->num_points;
      pFVar5 = border->tags;
      uVar3 = border->num_points;
      pFVar4[uVar2].x = to->x;
      pFVar4[uVar2].y = to->y;
      pFVar5[uVar3] = '\x01';
      border->num_points = border->num_points + 1;
    }
  }
  else {
    pFVar4 = border->points;
    FVar1 = border->num_points;
    pFVar4[FVar1 - 1].x = to->x;
    pFVar4[FVar1 - 1].y = to->y;
  }
  border->movable = movable;
  return (FT_Error)vec;
}

Assistant:

static FT_Error
  ft_stroke_border_lineto( FT_StrokeBorder  border,
                           FT_Vector*       to,
                           FT_Bool          movable )
  {
    FT_Error  error = FT_Err_Ok;


    FT_ASSERT( border->start >= 0 );

    if ( border->movable )
    {
      /* move last point */
      border->points[border->num_points - 1] = *to;
    }
    else
    {
      /* don't add zero-length lineto */
      if ( border->num_points > 0                                          &&
           FT_IS_SMALL( border->points[border->num_points - 1].x - to->x ) &&
           FT_IS_SMALL( border->points[border->num_points - 1].y - to->y ) )
        return error;

      /* add one point */
      error = ft_stroke_border_grow( border, 1 );
      if ( !error )
      {
        FT_Vector*  vec = border->points + border->num_points;
        FT_Byte*    tag = border->tags   + border->num_points;


        vec[0] = *to;
        tag[0] = FT_STROKE_TAG_ON;

        border->num_points += 1;
      }
    }
    border->movable = movable;
    return error;
  }